

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

void __thiscall DISTRHO::String::~String(String *this)

{
  String *this_local;
  
  if (this->fBuffer == (char *)0x0) {
    d_safe_assert("fBuffer != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/dpf/distrho/src/../extra/String.hpp"
                  ,0xf2);
  }
  else {
    if ((this->fBufferAlloc & 1U) != 0) {
      free(this->fBuffer);
    }
    this->fBuffer = (char *)0x0;
    this->fBufferLen = 0;
    this->fBufferAlloc = false;
  }
  return;
}

Assistant:

~String() noexcept
    {
        DISTRHO_SAFE_ASSERT_RETURN(fBuffer != nullptr,);

        if (fBufferAlloc)
            std::free(fBuffer);

        fBuffer      = nullptr;
        fBufferLen   = 0;
        fBufferAlloc = false;
    }